

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * NJamSpell::LoadFile(string *__return_storage_ptr__,string *fileName)

{
  streambuf *psVar1;
  ostringstream local_398 [8];
  ostringstream out;
  undefined1 local_220 [8];
  ifstream in;
  string *fileName_local;
  
  std::ifstream::ifstream(local_220,(string *)fileName,_S_bin);
  std::__cxx11::ostringstream::ostringstream(local_398);
  psVar1 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_398,psVar1);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_398);
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::string LoadFile(const std::string& fileName) {
    std::ifstream in(fileName, std::ios::binary);
    std::ostringstream out;
    out << in.rdbuf();
    return out.str();
}